

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_set_key_test(void)

{
  ushort uVar1;
  int iVar2;
  char acStackY_b8 [8];
  undefined8 uStackY_b0;
  ushort *local_a8;
  size_t in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  void *pvStack_90;
  int cmp;
  char *kv_str;
  key_len_t kv_len_dec;
  key_len_t kv_len;
  void *kv_addr;
  size_t str_len;
  uint8_t *key;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char str [11];
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  uStackY_b0 = 0x1012b8;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStackY_b0 = 0x1012cd;
  memleak_start();
  key._5_1_ = 't';
  key._6_1_ = 'e';
  key._7_1_ = 's';
  cStack_60 = 't';
  cStack_5f = 's';
  cStack_5e = 't';
  cStack_5d = 'r';
  cStack_5c = 'i';
  str[0] = 'n';
  str[1] = 'g';
  str[2] = '\0';
  uStackY_b0 = 0x101310;
  btree_str_kv_set_key
            (pvStack_90,(void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  uVar1 = *local_a8 >> 8 | *local_a8 << 8;
  if (uVar1 != 0xb) {
    uStackY_b0 = 0x101375;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x30);
    kv_set_key_test::__test_pass = 0;
    if (uVar1 != 0xb) {
      uStackY_b0 = 0x1013aa;
      __assert_fail("kv_len_dec == str_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x30,"void kv_set_key_test()");
    }
  }
  if (acStackY_b8 == (char *)0x0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x34);
    kv_set_key_test::__test_pass = 0;
    __assert_fail("kv_str != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x34,"void kv_set_key_test()");
  }
  memcpy(acStackY_b8,local_a8 + 1,0xb);
  iVar2 = strcmp(acStackY_b8,(char *)((long)&key + 5));
  if (iVar2 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x37);
    kv_set_key_test::__test_pass = 0;
    if (iVar2 != 0) {
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x37,"void kv_set_key_test()");
    }
  }
  free(local_a8);
  memleak_end();
  if (kv_set_key_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv set key test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv set key test");
  }
  return;
}

Assistant:

void kv_set_key_test()
{

    TEST_INIT();
    memleak_start();

    char str[] = "teststring";
    uint8_t *key = alca(uint8_t, sizeof(void *));
    size_t str_len = sizeof(str);

    // set key ptr
    btree_str_kv_set_key(key, str, str_len);
    void *kv_addr;
    memcpy(&kv_addr, key, sizeof(void *));

    // check key len
    key_len_t kv_len;
    memcpy(&kv_len, (key_len_t *)kv_addr, sizeof(key_len_t));
    key_len_t kv_len_dec = _endian_decode(kv_len);
    TEST_CHK(kv_len_dec == str_len);

    // check key size
    char *kv_str = alca(char, str_len);
    TEST_CHK(kv_str != NULL);
    memcpy(kv_str, ((char *)kv_addr) + sizeof(key_len_t), str_len);
    int cmp = strcmp(kv_str, str);
    TEST_CHK(cmp == 0);
    free(kv_addr);

    memleak_end();
    TEST_RESULT("kv set key test");
}